

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O1

int json_pointer_result_get_recursive(json_object *obj,char *path,json_pointer_get_result *res)

{
  bool bVar1;
  size_t idx_00;
  int iVar2;
  int iVar3;
  char *path_00;
  size_t sVar4;
  json_object *pjVar5;
  int *piVar6;
  char *__s;
  size_t idx;
  json_object *local_48;
  json_pointer_get_result *local_40;
  size_t local_38;
  
  local_38 = 0;
  local_48 = obj;
  if (*path != '/') {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    return -1;
  }
  __s = path + 1;
  path_00 = strchr(__s,0x2f);
  pjVar5 = local_48;
  if (path_00 != (char *)0x0) {
    *path_00 = '\0';
  }
  iVar2 = json_object_is_type(local_48,json_type_array);
  if (iVar2 == 0) {
    string_replace_all_occurrences_with_char(__s,"~1",'/');
    string_replace_all_occurrences_with_char(__s,"~0",'~');
    iVar2 = json_object_object_get_ex(pjVar5,__s,&local_48);
    if (iVar2 != 0) {
      iVar2 = 0;
      bVar1 = true;
      goto LAB_0010a0f7;
    }
    piVar6 = __errno_location();
    *piVar6 = 2;
  }
  else {
    iVar3 = is_valid_index(__s,&local_38);
    idx_00 = local_38;
    iVar2 = -1;
    if (iVar3 != 0) {
      local_40 = res;
      sVar4 = json_object_array_length(pjVar5);
      if ((idx_00 < sVar4) &&
         (pjVar5 = json_object_array_get_idx(pjVar5,idx_00), pjVar5 != (json_object *)0x0)) {
        iVar2 = 0;
        bVar1 = true;
        res = local_40;
        local_48 = pjVar5;
      }
      else {
        piVar6 = __errno_location();
        *piVar6 = 2;
        bVar1 = false;
        res = local_40;
      }
      goto LAB_0010a0f7;
    }
  }
  iVar2 = -1;
  bVar1 = false;
LAB_0010a0f7:
  if (bVar1) {
    if (path_00 == (char *)0x0) {
      iVar2 = 0;
      if (res != (json_pointer_get_result *)0x0) {
        res->parent = obj;
        res->obj = local_48;
        iVar3 = json_object_is_type(obj,json_type_array);
        if (iVar3 == 0) {
          res->key_in_parent = __s;
          iVar2 = 0;
        }
        else {
          res->index_in_parent = (uint32_t)local_38;
        }
      }
    }
    else {
      *path_00 = '/';
      iVar2 = json_pointer_result_get_recursive(local_48,path_00,res);
    }
  }
  return iVar2;
}

Assistant:

static int json_pointer_result_get_recursive(struct json_object *obj, char *path,
                                             struct json_pointer_get_result *res)
{
	struct json_object *parent_obj = obj;
	size_t idx = 0;
	char *endp;
	int rc;

	/* All paths (on each recursion level must have a leading '/' */
	if (path[0] != '/')
	{
		errno = EINVAL;
		return -1;
	}
	path++;

	endp = strchr(path, '/');
	if (endp)
		*endp = '\0';

	/* If we err-ed here, return here */
	if ((rc = json_pointer_get_single_path(obj, path, &obj, &idx)))
		return rc;

	if (endp)
	{
		/* Put the slash back, so that the sanity check passes on next recursion level */
		*endp = '/';
		return json_pointer_result_get_recursive(obj, endp, res);
	}

	/* We should be at the end of the recursion here */
	if (res) {
		res->parent = parent_obj;
		res->obj = obj;
		if (json_object_is_type(res->parent, json_type_array))
			res->index_in_parent = idx;
		else
			res->key_in_parent = path;
	}

	return 0;
}